

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::ThingImpl::intercept(ThingImpl *this,InterceptContext context)

{
  long *in_RDX;
  PointerBuilder local_98;
  StructBuilder local_78;
  undefined1 local_50;
  SegmentBuilder *local_38;
  CapTableBuilder *pCStack_30;
  WirePointer *local_28;
  
  local_50 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_38);
  local_98.pointer = local_28;
  local_98.segment = local_38;
  local_98.capTable = pCStack_30;
  PointerBuilder::getStruct(&local_78,&local_98,(StructSize)0x10000,(word *)0x0);
  local_98.segment = local_78.segment;
  local_98.capTable = local_78.capTable;
  local_98.pointer = local_78.pointers;
  PointerBuilder::setBlob<capnp::Text>
            (&local_98,(StringPtr)*(StringPtr *)&context.hook[1]._vptr_CallContextHook);
  kj::_::readyNow();
  (this->super_Server)._vptr_Server = (_func_int **)local_78.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> intercept(InterceptContext context) override {
    context.getResults().setText(text);
    return kj::READY_NOW;
  }